

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O0

void __thiscall Regex::dumpElement(Regex *this,Element *cur_node,string *dump)

{
  string *psVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream strm;
  ostream local_198 [376];
  string *local_20;
  string *dump_local;
  Element *cur_node_local;
  Regex *this_local;
  
  local_20 = dump;
  dump_local = (string *)cur_node;
  cur_node_local = (Element *)this;
  _Var2 = std::operator|(_S_in,_S_out);
  std::__cxx11::stringstream::stringstream(local_1a8,_Var2);
  switch(*(undefined4 *)((long)&dump_local->field_2 + 8)) {
  case 1:
    std::operator<<(local_198,"[S]");
    break;
  case 2:
    std::operator<<(local_198,"[O]");
    if (*(int *)(dump_local + 1) != *(int *)&dump_local[1].field_0x4) {
      poVar3 = std::operator<<(local_198,"{");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(dump_local + 1));
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&dump_local[1].field_0x4);
      std::operator<<(poVar3,"}");
    }
    break;
  case 3:
    std::operator<<(local_198,"[T:");
    if (((dump_local->field_2)._M_local_buf[0xc] == '\0') &&
       ((dump_local->field_2)._M_local_buf[0xd] == '\x7f')) {
      std::operator<<(local_198,".");
    }
    else if ((dump_local->field_2)._M_local_buf[0xc] == (dump_local->field_2)._M_local_buf[0xd]) {
      if ((dump_local->field_2)._M_local_buf[0xc] < ' ') {
        poVar3 = std::operator<<(local_198,"0x");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,(int)(dump_local->field_2)._M_local_buf[0xc]);
        std::ostream::operator<<(poVar3,std::dec);
      }
      else {
        std::operator<<(local_198,(dump_local->field_2)._M_local_buf[0xc]);
      }
    }
    else {
      poVar3 = std::operator<<(local_198,(dump_local->field_2)._M_local_buf[0xc]);
      poVar3 = std::operator<<(poVar3,"-");
      std::operator<<(poVar3,(dump_local->field_2)._M_local_buf[0xd]);
    }
    std::operator<<(local_198,"]");
    if (*(int *)(dump_local + 1) != *(int *)&dump_local[1].field_0x4) {
      poVar3 = std::operator<<(local_198,"{");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(dump_local + 1));
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&dump_local[1].field_0x4);
      std::operator<<(poVar3,"}");
    }
    break;
  case 4:
    if ((dump_local[1]._M_string_length & 1) == 0) {
      std::operator<<(local_198,"[C]");
    }
    else {
      std::operator<<(local_198,"[C^]");
    }
    if ((*(int *)(dump_local + 1) != 1) || (*(int *)&dump_local[1].field_0x4 != 1)) {
      poVar3 = std::operator<<(local_198,"{");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(dump_local + 1));
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&dump_local[1].field_0x4);
      std::operator<<(poVar3,"}");
    }
    break;
  default:
    jh_log_print(1,"void Regex::dumpElement(Element *, std::string &)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                 ,0x1dc,"Bad element Type");
  }
  psVar1 = local_20;
  std::__cxx11::stringstream::str();
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void	Regex::dumpElement( Element *cur_node, std::string &dump )
{
	std::stringstream strm( std::stringstream::in | std::stringstream::out );
	
	switch ( cur_node->mType )
	{
		case TYPE_SEQUENCE:
			LOG_INFO( "Seq" );
			strm << "[S]";
			break;
			
		case TYPE_OR:
			LOG_INFO( "Or" );
			strm << "[O]";
			if ( cur_node->mRepeatMin != cur_node->mRepeatMax )
				strm << "{" << cur_node->mRepeatMin << "," << cur_node->mRepeatMax << "}";
			break;

		case TYPE_TERMINAL:
			LOG_INFO( "Terminal" );
			strm << "[T:";
			if ( cur_node->mTermStartChar == 0 && cur_node->mTermEndChar == 127 )
				strm << ".";
			else if ( cur_node->mTermStartChar == cur_node->mTermEndChar )
			{
				if ( cur_node->mTermStartChar < ' ' )
					strm << "0x" << std::hex << (int)cur_node->mTermStartChar << std::dec;
				else
					strm << cur_node->mTermStartChar;
			}
			else
			{
				strm << cur_node->mTermStartChar << "-" << cur_node->mTermEndChar;
			}
			strm << "]";

			if ( cur_node->mRepeatMin != cur_node->mRepeatMax )
				strm << "{" << cur_node->mRepeatMin << "," << cur_node->mRepeatMax << "}";
			break;

		case TYPE_CLASS:
			LOG_INFO( "Class" );
			
			if ( cur_node->mClassInvert )
				strm << "[C^]";
			else
				strm << "[C]";
				
			if ( cur_node->mRepeatMin != 1 || cur_node->mRepeatMax != 1 )
				strm << "{" << cur_node->mRepeatMin << "," << cur_node->mRepeatMax << "}";
			break;
			
		default:
			LOG_ERR_FATAL( "Bad element Type" );
			break;
	}

	dump.append( strm.str() );
}